

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

_Bool store_will_buy(store *store,object *obj)

{
  _Bool _Var1;
  wchar_t wVar2;
  object_buy *poVar3;
  
  _Var1 = true;
  if (store->sidx != store_home_idx) {
    wVar2 = object_value(obj,L'\x01');
    if ((L'\0' < wVar2) ||
       ((((player->opts).opt[0x25] == true && (_Var1 = tval_has_variable_power(obj), _Var1)) &&
        (_Var1 = object_runes_known(obj), !_Var1)))) {
      poVar3 = store->buy;
      if (poVar3 == (object_buy *)0x0) {
        return true;
      }
      do {
        if (poVar3->tval == (ulong)obj->tval) {
          if (poVar3->flag == 0) {
            return true;
          }
          _Var1 = flag_has_dbg(obj->flags,6,(int)poVar3->flag,"obj->flags","buy->flag");
          if ((_Var1) && (_Var1 = object_flag_is_known(player,obj,(wchar_t)poVar3->flag), _Var1)) {
            return true;
          }
        }
        poVar3 = poVar3->next;
      } while (poVar3 != (object_buy *)0x0);
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool store_will_buy(struct store *store, const struct object *obj)
{
	struct object_buy *buy;

	/* Home accepts anything */
	if (store_is_home(store)) return true;

	/* Ignore apparently worthless items, except no-selling {??} items */
	if (object_value(obj, 1) <= 0 && !(OPT(player, birth_no_selling) &&
									   tval_has_variable_power(obj) &&
									   !object_runes_known(obj))) {
		return false;
	}

	/* No buy list means we buy anything */
	if (!store->buy) return true;

	/* Run through the buy list */
	for (buy = store->buy; buy; buy = buy->next) {
		/* Wrong tval */
		if (buy->tval != obj->tval) continue;

		/* No flag means we're good */
		if (!buy->flag) return true;

		/* OK if the object is known to have the flag */
		if (of_has(obj->flags, buy->flag) &&
			object_flag_is_known(player, obj, buy->flag))
			return true;
	}

	/* Not on the list */
	return false;
}